

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O2

rb_result_t rb_tree_empty(rb_tree *tree,int *is_empty)

{
  uint __line;
  char *__assertion;
  
  if (tree == (rb_tree *)0x0) {
    __assertion = "\"tree != NULL\" && 0";
    __line = 0x75;
  }
  else {
    if (is_empty != (int *)0x0) {
      *is_empty = (uint)(tree->root == (rb_tree_node *)0x0);
      return 0;
    }
    __assertion = "\"is_empty != NULL\" && 0";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                ,__line,"rb_result_t rb_tree_empty(struct rb_tree *, int *)");
}

Assistant:

rb_result_t rb_tree_empty(struct rb_tree *tree,
                          int *is_empty)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(is_empty != NULL);

    *is_empty = !!(tree->root == NULL);

    return ret;
}